

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void CheckHash<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
               (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                e)

{
  bool bVar1;
  iterator this;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  *pBVar2;
  AssertHelper *this_00;
  ExprBase in_RDI;
  AssertionResult gtest_ar;
  iterator end;
  iterator i;
  size_t hash;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *in_stack_ffffffffffffff58;
  unsigned_long *in_stack_ffffffffffffff60;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  *in_stack_ffffffffffffff68;
  ExprBase in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  Type in_stack_ffffffffffffff8c;
  AssertionResult local_50;
  ExprBase local_40;
  Impl **local_30;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> message;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  *local_10;
  
  mp::internal::ExprBase::kind((ExprBase *)0x148e9c);
  local_10 = (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              *)mp::internal::HashCombine<int>
                          ((size_t)in_stack_ffffffffffffff70.impl_,(int *)in_stack_ffffffffffffff68)
  ;
  this = mp::
         BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
         ::begin((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                  *)in_stack_ffffffffffffff58);
  local_30 = (Impl **)mp::
                      BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                      ::end(in_stack_ffffffffffffff68);
  while (message.ptr_ = local_30,
        bVar1 = mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
                operator!=((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
                           &stack0xffffffffffffffe0,
                           (ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>)
                           local_30), bVar1) {
    local_40.impl_ =
         (Impl *)mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
                 operator*(in_stack_ffffffffffffff58);
    mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
    BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)local_10,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffff70.impl_,
               (type_conflict)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    pBVar2 = (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              *)mp::internal::HashCombine<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                          ((size_t)in_stack_ffffffffffffff70.impl_,
                           (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)local_10);
    mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator++
              ((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
               &stack0xffffffffffffffe0);
    in_stack_ffffffffffffff68 = local_10;
    local_30 = message.ptr_;
    local_10 = pBVar2;
  }
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_ffffffffffffff68,
             (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              )in_stack_ffffffffffffff70.impl_,
             (type_conflict)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
            ((hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),(Expr)in_RDI.impl_);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (char *)in_stack_ffffffffffffff70.impl_,(unsigned_long *)in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_RDI.impl_);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x148fe3)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_RDI.impl_,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7c,(char *)in_stack_ffffffffffffff70.impl_);
    testing::internal::AssertHelper::operator=((AssertHelper *)this.ptr_,(Message *)message.ptr_);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x149031);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x149081);
  return;
}

Assistant:

void CheckHash(ExprType e) {
  size_t hash = HashCombine<int>(0, e.kind());
  for (typename ExprType::iterator i = e.begin(), end = e.end(); i != end; ++i)
    hash = HashCombine<Expr>(hash, *i);
  EXPECT_EQ(hash, ExprHash()(e));
}